

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O1

void __thiscall
helics::CloningFilter::CloningFilter(CloningFilter *this,Core *core,string_view filtName)

{
  Core *pCVar1;
  int iVar2;
  char *pcVar3;
  undefined8 in_R9;
  undefined1 local_49;
  CloneFilterOperation *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<helics::FilterOperations> local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  pcVar3 = filtName._M_str;
  (this->super_Filter).super_Interface._vptr_Interface = (_func_int **)&PTR__Interface_004d9728;
  (this->super_Filter).super_Interface.mCore = core;
  (this->super_Filter).super_Interface.handle.hid = -1700000000;
  (this->super_Filter).super_Interface.mName._M_dataplus._M_p =
       (pointer)&(this->super_Filter).super_Interface.mName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_Filter).super_Interface.mName,pcVar3,pcVar3 + filtName._M_len);
  (this->super_Filter).cloning = false;
  (this->super_Filter).disableAssign = false;
  (this->super_Filter).filtOp.
  super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_Filter).filtOp.
  super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Filter).super_Interface._vptr_Interface = (_func_int **)&PTR__Filter_004db630;
  pCVar1 = (this->super_Filter).super_Interface.mCore;
  local_28 = 0;
  uStack_20 = 0;
  iVar2 = (*pCVar1->_vptr_Core[0x3a])(pCVar1,filtName._M_len,pcVar3,0,0,in_R9,0,0);
  (this->super_Filter).super_Interface.handle.hid = iVar2;
  local_48 = (CloneFilterOperation *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::CloneFilterOperation,std::allocator<helics::CloneFilterOperation>>
            (&_Stack_40,&local_48,(allocator<helics::CloneFilterOperation> *)&local_49);
  local_38.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_FilterOperations;
  local_38.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_40._M_pi;
  local_48 = (CloneFilterOperation *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Filter::setFilterOperations(&this->super_Filter,&local_38);
  if (local_38.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  return;
}

Assistant:

CloningFilter::CloningFilter(Core* core, std::string_view filtName):
    Filter(core, filtName, InterfaceHandle())
{
    handle = mCore->registerCloningFilter(filtName, std::string_view(), std::string_view());
    setFilterOperations(std::make_shared<CloneFilterOperation>());
}